

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uparse.cpp
# Opt level: O0

int32_t u_parseString(char *s,UChar *dest,int32_t destCapacity,uint32_t *pFirst,
                     UErrorCode *pErrorCode)

{
  UBool UVar1;
  UErrorCode UVar2;
  ulong uVar3;
  int iVar4;
  int local_48;
  int32_t destLength;
  uint32_t value;
  char *end;
  UErrorCode *pErrorCode_local;
  uint32_t *pFirst_local;
  UChar *pUStack_20;
  int32_t destCapacity_local;
  UChar *dest_local;
  char *s_local;
  
  end = (char *)pErrorCode;
  pErrorCode_local = (UErrorCode *)pFirst;
  pFirst_local._4_4_ = destCapacity;
  pUStack_20 = dest;
  dest_local = (UChar *)s;
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if (((dest_local == (UChar *)0x0) || (pFirst_local._4_4_ < 0)) ||
       ((0 < pFirst_local._4_4_ && (pUStack_20 == (UChar *)0x0)))) {
      end[0] = '\x01';
      end[1] = '\0';
      end[2] = '\0';
      end[3] = '\0';
      s_local._4_4_ = 0;
    }
    else {
      if (pErrorCode_local != (UErrorCode *)0x0) {
        *pErrorCode_local = ~U_ZERO_ERROR;
      }
      local_48 = 0;
      while ((dest_local = (UChar *)u_skipWhitespace((char *)dest_local), (char)*dest_local != ';'
             && ((char)*dest_local != '\0'))) {
        uVar3 = strtoul((char *)dest_local,(char **)&destLength,0x10);
        UVar2 = (UErrorCode)uVar3;
        if ((_destLength <= dest_local) ||
           ((((((char)*_destLength != ' ' && ((char)*_destLength != '\t')) &&
              ((char)*_destLength != '\r')) &&
             ((((char)*_destLength != '\n' && ((char)*_destLength != ';')) &&
              ((char)*_destLength != '\0')))) || (0x10ffff < (uint)UVar2)))) {
          end[0] = '\t';
          end[1] = '\0';
          end[2] = '\0';
          end[3] = '\0';
          return 0;
        }
        if (pErrorCode_local != (UErrorCode *)0x0) {
          *pErrorCode_local = UVar2;
          pErrorCode_local = (UErrorCode *)0x0;
        }
        iVar4 = 2;
        if ((uint)UVar2 < 0x10000) {
          iVar4 = 1;
        }
        if (pFirst_local._4_4_ < local_48 + iVar4) {
          iVar4 = 2;
          if ((uint)UVar2 < 0x10000) {
            iVar4 = 1;
          }
          local_48 = iVar4 + local_48;
        }
        else if ((uint)UVar2 < 0x10000) {
          pUStack_20[local_48] = (UChar)uVar3;
          local_48 = local_48 + 1;
        }
        else {
          iVar4 = local_48 + 1;
          pUStack_20[local_48] = (short)((uint)UVar2 >> 10) + L'ퟀ';
          local_48 = local_48 + 2;
          pUStack_20[iVar4] = (UChar)uVar3 & 0x3ffU | 0xdc00;
        }
        dest_local = _destLength;
      }
      if (local_48 < pFirst_local._4_4_) {
        pUStack_20[local_48] = L'\0';
      }
      else if (local_48 == pFirst_local._4_4_) {
        end[0] = -0x7c;
        end[1] = -1;
        end[2] = -1;
        end[3] = -1;
      }
      else {
        end[0] = '\x0f';
        end[1] = '\0';
        end[2] = '\0';
        end[3] = '\0';
      }
      s_local._4_4_ = local_48;
    }
  }
  else {
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_parseString(const char *s,
              UChar *dest, int32_t destCapacity,
              uint32_t *pFirst,
              UErrorCode *pErrorCode) {
    char *end;
    uint32_t value;
    int32_t destLength;

    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(s==NULL || destCapacity<0 || (destCapacity>0 && dest==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    if(pFirst!=NULL) {
        *pFirst=0xffffffff;
    }

    destLength=0;
    for(;;) {
        s=u_skipWhitespace(s);
        if(*s==';' || *s==0) {
            if(destLength<destCapacity) {
                dest[destLength]=0;
            } else if(destLength==destCapacity) {
                *pErrorCode=U_STRING_NOT_TERMINATED_WARNING;
            } else {
                *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
            }
            return destLength;
        }

        /* read one code point */
        value=(uint32_t)uprv_strtoul(s, &end, 16);
        if(end<=s || (!U_IS_INV_WHITESPACE(*end) && *end!=';' && *end!=0) || value>=0x110000) {
            *pErrorCode=U_PARSE_ERROR;
            return 0;
        }

        /* store the first code point */
        if(pFirst!=NULL) {
            *pFirst=value;
            pFirst=NULL;
        }

        /* append it to the destination array */
        if((destLength+U16_LENGTH(value))<=destCapacity) {
            U16_APPEND_UNSAFE(dest, destLength, value);
        } else {
            destLength+=U16_LENGTH(value);
        }

        /* go to the following characters */
        s=end;
    }
}